

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::stop_announcing(torrent *this)

{
  time_point32 now;
  torrent *this_local;
  
  if (((byte)this->field_0x5c0 >> 6 & 1) != 0) {
    boost::asio::
    basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::cancel(&this->m_tracker_timer);
    this->field_0x5c0 = this->field_0x5c0 & 0xbf;
    now = time_now32();
    tracker_list::stop_announcing(&this->m_trackers,now);
    announce_with_tracker(this,stopped);
  }
  return;
}

Assistant:

void torrent::stop_announcing()
	{
		TORRENT_ASSERT(is_single_thread());
		if (!m_announcing) return;

		m_tracker_timer.cancel();

		m_announcing = false;

		m_trackers.stop_announcing(aux::time_now32());

		announce_with_tracker(event_t::stopped);
	}